

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

QString * QtPrivate::QStringList_join(QStringList *that,QChar *sep,qsizetype seplen)

{
  qsizetype asize;
  qsizetype qVar1;
  QList<QString> *in_RSI;
  QList<QString> *in_RDI;
  qsizetype i;
  qsizetype size;
  qsizetype totalLength;
  QString *res;
  QString *in_stack_ffffffffffffffa8;
  QList<QString> *str;
  QString *in_stack_ffffffffffffffc0;
  QString *this;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  QStringList *in_stack_ffffffffffffffd0;
  
  str = in_RDI;
  asize = accumulatedSize(in_stack_ffffffffffffffd0,
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  qVar1 = QList<QString>::size(in_RSI);
  (str->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (str->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  (str->d).size = -0x5555555555555556;
  QString::QString((QString *)0x16911b);
  if (asize != 0) {
    QString::reserve(in_stack_ffffffffffffffc0,asize);
    for (this = (QString *)0x0; (long)this < qVar1; this = (QString *)((long)&(this->d).d + 1)) {
      if (this != (QString *)0x0) {
        QString::append(this,(QChar *)str,(qsizetype)in_RDI);
      }
      QList<QString>::at(in_RDI,(qsizetype)in_stack_ffffffffffffffa8);
      QString::operator+=((QString *)in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  return (QString *)in_RDI;
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList *that, const QChar *sep, qsizetype seplen)
{
    const qsizetype totalLength = accumulatedSize(*that, seplen);
    const qsizetype size = that->size();

    QString res;
    if (totalLength == 0)
        return res;
    res.reserve(totalLength);
    for (qsizetype i = 0; i < size; ++i) {
        if (i)
            res.append(sep, seplen);
        res += that->at(i);
    }
    return res;
}